

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelationship::IfcRelationship(IfcRelationship *this,void **vtt)

{
  void *pvVar1;
  _func_int **pp_Var2;
  
  IfcRoot::IfcRoot(&this->super_IfcRoot,vtt + 1);
  pvVar1 = vtt[5];
  *(void **)&(this->super_IfcRoot).field_0x88 = pvVar1;
  *(void **)(&(this->super_IfcRoot).field_0x88 + *(long *)((long)pvVar1 + -0x18)) = vtt[6];
  pp_Var2 = (_func_int **)*vtt;
  (this->super_IfcRoot).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper
       = pp_Var2;
  *(void **)((long)&(this->super_IfcRoot).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                    _vptr_ObjectHelper + (long)pp_Var2[-3]) = vtt[7];
  *(void **)&(this->super_IfcRoot).field_0x88 = vtt[8];
  return;
}

Assistant:

IfcRelationship() : Object("IfcRelationship") {}